

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::RandomSSBOLayoutCase::generateBlock
          (RandomSSBOLayoutCase *this,Random *rnd,deUint32 layoutFlags)

{
  Random *this_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  BufferBlock *pBVar6;
  VarType *this_01;
  float fVar7;
  int local_1c0;
  int local_164;
  int local_138;
  int arrSize;
  int instanceNdx;
  bool isUnsizedArr;
  VarType *lastType;
  __normal_iterator<deqp::gles31::bb::BufferVar_*,_std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>_>
  local_120;
  reference local_118;
  BufferVar *lastVar;
  iterator iStack_108;
  int ndx;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_100;
  value_type_conflict2 local_f8 [4];
  undefined1 local_e8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> layoutFlagCandidates;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  int local_84;
  int local_80;
  int numVars;
  int numInstances;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  BufferBlock *local_28;
  BufferBlock *block;
  float instanceArrayWeight;
  deUint32 layoutFlags_local;
  Random *rnd_local;
  RandomSSBOLayoutCase *this_local;
  
  block._0_4_ = 0x3e99999a;
  block._4_4_ = layoutFlags;
  _instanceArrayWeight = rnd;
  rnd_local = (Random *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Block",&local_69);
  std::operator+(&local_48,&local_68,(char)this->m_blockNdx + 'A');
  pcVar5 = (char *)std::__cxx11::string::c_str();
  pBVar6 = bb::ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,pcVar5);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  local_28 = pBVar6;
  if ((this->m_maxInstances < 1) ||
     (fVar7 = de::Random::getFloat(_instanceArrayWeight), 0.3 <= fVar7)) {
    local_164 = 0;
  }
  else {
    local_164 = de::Random::getInt(_instanceArrayWeight,0,this->m_maxInstances);
  }
  local_80 = local_164;
  local_84 = de::Random::getInt(_instanceArrayWeight,1,this->m_maxBlockMembers);
  if (0 < local_80) {
    bb::BufferBlock::setArraySize(local_28,local_80);
  }
  if ((0 < local_80) || (bVar1 = de::Random::getBool(_instanceArrayWeight), bVar1)) {
    pBVar6 = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"block",
               (allocator<char> *)
               ((long)&layoutFlagCandidates.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::operator+(&local_a8,&local_c8,(char)this->m_blockNdx + 'A');
    pcVar5 = (char *)std::__cxx11::string::c_str();
    bb::BufferBlock::setInstanceName(pBVar6,pcVar5);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&layoutFlagCandidates.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  local_f8[3] = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8,local_f8 + 3);
  if ((this->m_features & 0x100) != 0) {
    local_f8[2] = 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8,local_f8 + 2);
  }
  if ((this->m_features & 0x200) != 0) {
    local_f8[1] = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8,local_f8 + 1);
  }
  if ((this->m_features & 0x400) != 0) {
    local_f8[0] = 4;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8,local_f8);
  }
  this_00 = _instanceArrayWeight;
  local_100._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  iStack_108 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  uVar3 = de::Random::
          choose<unsigned_int,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    (this_00,local_100,
                     (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )iStack_108._M_current);
  block._4_4_ = uVar3 | block._4_4_;
  if ((this->m_features & 0x1000) != 0) {
    uVar3 = de::Random::choose<unsigned_int,unsigned_int_const*>
                      (_instanceArrayWeight,generateBlock::matrixCandidates,
                       generateType::precisionCandidates);
    block._4_4_ = uVar3 | block._4_4_;
  }
  bb::BufferBlock::setFlags(local_28,block._4_4_);
  for (lastVar._4_4_ = 0; lastVar._4_4_ < local_84; lastVar._4_4_ = lastVar._4_4_ + 1) {
    generateBufferVar(this,_instanceArrayWeight,local_28,lastVar._4_4_ + 1 == local_84);
  }
  if (0 < local_84) {
    lastType = (VarType *)bb::BufferBlock::end(local_28);
    local_120 = __gnu_cxx::
                __normal_iterator<deqp::gles31::bb::BufferVar_*,_std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>_>
                ::operator-((__normal_iterator<deqp::gles31::bb::BufferVar_*,_std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>_>
                             *)&lastType,1);
    local_118 = __gnu_cxx::
                __normal_iterator<deqp::gles31::bb::BufferVar_*,_std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>_>
                ::operator*(&local_120);
    this_01 = bb::BufferVar::getType(local_118);
    bVar2 = glu::VarType::isArrayType(this_01);
    bVar1 = false;
    if (bVar2) {
      iVar4 = glu::VarType::getArraySize(this_01);
      bVar1 = iVar4 == -1;
    }
    if (bVar1) {
      local_138 = 0;
      while( true ) {
        if (local_80 == 0) {
          local_1c0 = 1;
        }
        else {
          local_1c0 = local_80;
        }
        if (local_1c0 <= local_138) break;
        iVar4 = de::Random::getInt(_instanceArrayWeight,0,this->m_maxArrayLength);
        bb::BufferBlock::setLastUnsizedArraySize(local_28,local_138,iVar4);
        local_138 = local_138 + 1;
      }
    }
  }
  this->m_blockNdx = this->m_blockNdx + 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  return;
}

Assistant:

void RandomSSBOLayoutCase::generateBlock (de::Random& rnd, deUint32 layoutFlags)
{
	DE_ASSERT(m_blockNdx <= 'z' - 'a');

	const float		instanceArrayWeight	= 0.3f;
	BufferBlock&	block				= m_interface.allocBlock((string("Block") + (char)('A' + m_blockNdx)).c_str());
	int				numInstances		= (m_maxInstances > 0 && rnd.getFloat() < instanceArrayWeight) ? rnd.getInt(0, m_maxInstances) : 0;
	int				numVars				= rnd.getInt(1, m_maxBlockMembers);

	if (numInstances > 0)
		block.setArraySize(numInstances);

	if (numInstances > 0 || rnd.getBool())
		block.setInstanceName((string("block") + (char)('A' + m_blockNdx)).c_str());

	// Layout flag candidates.
	vector<deUint32> layoutFlagCandidates;
	layoutFlagCandidates.push_back(0);
	if (m_features & FEATURE_PACKED_LAYOUT)
		layoutFlagCandidates.push_back(LAYOUT_PACKED);
	if ((m_features & FEATURE_SHARED_LAYOUT))
		layoutFlagCandidates.push_back(LAYOUT_SHARED);
	if (m_features & FEATURE_STD140_LAYOUT)
		layoutFlagCandidates.push_back(LAYOUT_STD140);

	layoutFlags |= rnd.choose<deUint32>(layoutFlagCandidates.begin(), layoutFlagCandidates.end());

	if (m_features & FEATURE_MATRIX_LAYOUT)
	{
		static const deUint32 matrixCandidates[] = { 0, LAYOUT_ROW_MAJOR, LAYOUT_COLUMN_MAJOR };
		layoutFlags |= rnd.choose<deUint32>(&matrixCandidates[0], &matrixCandidates[DE_LENGTH_OF_ARRAY(matrixCandidates)]);
	}

	block.setFlags(layoutFlags);

	for (int ndx = 0; ndx < numVars; ndx++)
		generateBufferVar(rnd, block, (ndx+1 == numVars));

	if (numVars > 0)
	{
		const BufferVar&	lastVar			= *(block.end()-1);
		const glu::VarType&	lastType		= lastVar.getType();
		const bool			isUnsizedArr	= lastType.isArrayType() && (lastType.getArraySize() == glu::VarType::UNSIZED_ARRAY);

		if (isUnsizedArr)
		{
			for (int instanceNdx = 0; instanceNdx < (numInstances ? numInstances : 1); instanceNdx++)
			{
				const int arrSize = rnd.getInt(0, m_maxArrayLength);
				block.setLastUnsizedArraySize(instanceNdx, arrSize);
			}
		}
	}

	m_blockNdx += 1;
}